

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

Type * slang::ast::PackedArrayType::fromDim
                 (Scope *scope,Type *elementType,ConstantRange dim,DeferredSourceRange sourceRange)

{
  Compilation *this;
  long lVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  bitwidth_t bVar5;
  Diagnostic *pDVar6;
  int iVar7;
  SourceRange sourceRange_00;
  ConstantRange local_38;
  uint local_2c;
  
  local_38 = dim;
  bVar3 = Type::isError(elementType);
  if (!bVar3) {
    iVar7 = dim.left;
    iVar4 = dim.right;
    this = scope->compilation;
    iVar2 = iVar7 - iVar4;
    if (iVar7 - iVar4 == 0 || iVar7 < iVar4) {
      iVar2 = -(iVar7 - iVar4);
    }
    bVar5 = Type::getBitWidth(elementType);
    lVar1 = (ulong)bVar5 * (ulong)(iVar2 + 1U);
    bVar3 = (int)((ulong)lVar1 >> 0x20) != 0;
    local_2c = (uint)lVar1;
    if (bVar3) {
      local_2c = 0;
    }
    if ((bool)(~bVar3 & local_2c < 0x1000000)) {
      elementType = (Type *)BumpAllocator::
                            emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange&,unsigned_int>
                                      (&this->super_BumpAllocator,elementType,&local_38,&local_2c);
      if ((SyntaxNode *)(sourceRange.node.value & 0xfffffffffffffffe) != (SyntaxNode *)0x0) {
        (((PackedArrayType *)elementType)->super_IntegralType).super_Type.super_Symbol.
        originatingSyntax = (SyntaxNode *)(sourceRange.node.value & 0xfffffffffffffffe);
      }
    }
    else {
      bVar5 = Type::getBitWidth(elementType);
      sourceRange_00 = slang::syntax::DeferredSourceRange::get(&sourceRange);
      pDVar6 = Scope::addDiag(scope,(DiagCode)0x1d0009,sourceRange_00);
      pDVar6 = Diagnostic::operator<<<unsigned_long>(pDVar6,(ulong)(iVar2 + 1U) * (ulong)bVar5);
      Diagnostic::operator<<<unsigned_int>(pDVar6,0xffffff);
      elementType = this->errorType;
    }
  }
  return (Type *)(PackedArrayType *)elementType;
}

Assistant:

const Type& PackedArrayType::fromDim(const Scope& scope, const Type& elementType, ConstantRange dim,
                                     DeferredSourceRange sourceRange) {
    if (elementType.isError())
        return elementType;

    auto& comp = scope.getCompilation();
    auto width = checkedMulU32(elementType.getBitWidth(), dim.width());
    if (!width || width > (uint32_t)SVInt::MAX_BITS) {
        uint64_t fullWidth = uint64_t(elementType.getBitWidth()) * dim.width();
        scope.addDiag(diag::PackedTypeTooLarge, sourceRange.get())
            << fullWidth << (uint32_t)SVInt::MAX_BITS;
        return comp.getErrorType();
    }

    auto result = comp.emplace<PackedArrayType>(elementType, dim, bitwidth_t(*width));
    if (auto syntax = sourceRange.syntax())
        result->setSyntax(*syntax);

    return *result;
}